

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void xatlas::DestroyOutputMeshes(Context *ctx)

{
  long lVar1;
  Mesh *pMVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  pMVar2 = (ctx->atlas).meshes;
  if (pMVar2 == (Mesh *)0x0) {
    return;
  }
  if (0 < (int)(ctx->atlas).meshCount) {
    lVar5 = 0;
    do {
      pMVar2 = (ctx->atlas).meshes + lVar5;
      if (pMVar2->chartArray != (Chart *)0x0) {
        if (pMVar2->chartCount != 0) {
          lVar3 = 0;
          uVar4 = 0;
          do {
            lVar1 = *(long *)((long)&pMVar2->chartArray->faceArray + lVar3);
            if (lVar1 != 0) {
              if (internal::s_free == (undefined *)0x0) {
                (*(code *)internal::s_realloc)(lVar1,0);
              }
              else {
                (*(code *)internal::s_free)();
              }
            }
            uVar4 = uVar4 + 1;
            lVar3 = lVar3 + 0x18;
          } while (uVar4 < pMVar2->chartCount);
          if (pMVar2->chartArray == (Chart *)0x0) goto LAB_0010d8fb;
        }
        if (internal::s_free == (undefined *)0x0) {
          (*(code *)internal::s_realloc)();
        }
        else {
          (*(code *)internal::s_free)();
        }
      }
LAB_0010d8fb:
      if (pMVar2->vertexArray != (Vertex *)0x0) {
        if (internal::s_free == (undefined *)0x0) {
          (*(code *)internal::s_realloc)();
        }
        else {
          (*(code *)internal::s_free)();
        }
      }
      if (pMVar2->indexArray != (uint32_t *)0x0) {
        if (internal::s_free == (undefined *)0x0) {
          (*(code *)internal::s_realloc)();
        }
        else {
          (*(code *)internal::s_free)();
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)(ctx->atlas).meshCount);
    pMVar2 = (ctx->atlas).meshes;
    if (pMVar2 == (Mesh *)0x0) goto LAB_0010d96e;
  }
  if (internal::s_free == (undefined *)0x0) {
    (*(code *)internal::s_realloc)(pMVar2,0);
  }
  else {
    (*(code *)internal::s_free)();
  }
LAB_0010d96e:
  (ctx->atlas).meshes = (Mesh *)0x0;
  return;
}

Assistant:

static void DestroyOutputMeshes(Context *ctx)
{
	if (!ctx->atlas.meshes)
		return;
	for (int i = 0; i < (int)ctx->atlas.meshCount; i++) {
		Mesh &mesh = ctx->atlas.meshes[i];
		if (mesh.chartArray) {
			for (uint32_t j = 0; j < mesh.chartCount; j++) {
				if (mesh.chartArray[j].faceArray)
					XA_FREE(mesh.chartArray[j].faceArray);
			}
			XA_FREE(mesh.chartArray);
		}
		if (mesh.vertexArray)
			XA_FREE(mesh.vertexArray);
		if (mesh.indexArray)
			XA_FREE(mesh.indexArray);
	}
	XA_FREE(ctx->atlas.meshes);
	ctx->atlas.meshes = nullptr;
}